

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_switches.cpp
# Opt level: O0

void __thiscall FTextureManager::InitSwitchList(FTextureManager *this)

{
  int iVar1;
  FTextureID FVar2;
  uint uVar3;
  FSwitchDef **__base;
  bool bVar4;
  bool local_82;
  FTextureID local_58;
  FTextureID local_54;
  FSwitchDef *local_50;
  FSwitchDef *def2;
  FSwitchDef *def1;
  char *list_p;
  FSwitchDef *local_28;
  char *alphSwitchList;
  FMemLump lumpdata;
  int lump;
  BITFIELD texflags;
  FTextureManager *this_local;
  
  lumpdata.Block.Chars._4_4_ = 3;
  lumpdata.Block.Chars._0_4_ = FWadCollection::CheckNumForName(&Wads,"SWITCHES");
  if ((int)lumpdata.Block.Chars != -1) {
    FWadCollection::ReadLump((FWadCollection *)&alphSwitchList,0x1f756a0);
    def1 = (FSwitchDef *)FMemLump::GetMem((FMemLump *)&alphSwitchList);
    local_28 = def1;
    while( true ) {
      bVar4 = true;
      if (def1->QuestPanel == false) {
        bVar4 = def1->field_0x13 != '\0';
      }
      if (!bVar4) break;
      iVar1 = strcasecmp((char *)def1,(char *)((long)&def1->PairDef + 1));
      if (iVar1 == 0) {
        Printf("Switch %s in SWITCHES has the same \'on\' state\n",def1);
      }
      else {
        local_54 = CheckForTexture(this,(char *)def1,1,3);
        bVar4 = FTextureID::Exists(&local_54);
        local_82 = false;
        if (bVar4) {
          local_58 = CheckForTexture(this,(char *)((long)&def1->PairDef + 1),1,3);
          local_82 = FTextureID::Exists(&local_58);
        }
        if (local_82 != false) {
          def2 = (FSwitchDef *)
                 M_Malloc_Dbg(0x20,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/textures/anim_switches.cpp"
                              ,0x57);
          local_50 = (FSwitchDef *)
                     M_Malloc_Dbg(0x20,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/textures/anim_switches.cpp"
                                  ,0x58);
          FVar2 = CheckForTexture(this,(char *)def1,1,3);
          local_50->frames[0].Texture.texnum = FVar2.texnum;
          (def2->PreTexture).texnum = local_50->frames[0].Texture.texnum;
          FVar2 = CheckForTexture(this,(char *)((long)&def1->PairDef + 1),1,3);
          def2->frames[0].Texture.texnum = FVar2.texnum;
          (local_50->PreTexture).texnum = def2->frames[0].Texture.texnum;
          local_50->Sound = 0;
          def2->Sound = 0;
          local_50->NumFrames = 1;
          def2->NumFrames = 1;
          local_50->frames[0].TimeMin = 0;
          def2->frames[0].TimeMin = 0;
          local_50->frames[0].TimeRnd = 0;
          def2->frames[0].TimeRnd = 0;
          AddSwitchPair(this,def2,local_50);
        }
      }
      def1 = (FSwitchDef *)&def1->Sound;
    }
    FMemLump::~FMemLump((FMemLump *)&alphSwitchList);
  }
  TArray<FSwitchDef_*,_FSwitchDef_*>::ShrinkToFit(&this->mSwitchDefs);
  __base = TArray<FSwitchDef_*,_FSwitchDef_*>::operator[](&this->mSwitchDefs,0);
  uVar3 = TArray<FSwitchDef_*,_FSwitchDef_*>::Size(&this->mSwitchDefs);
  qsort(__base,(ulong)uVar3,8,SortSwitchDefs);
  return;
}

Assistant:

void FTextureManager::InitSwitchList ()
{
	const BITFIELD texflags = TEXMAN_Overridable | TEXMAN_TryAny;
	int lump = Wads.CheckNumForName ("SWITCHES");

	if (lump != -1)
	{
		FMemLump lumpdata = Wads.ReadLump (lump);
		const char *alphSwitchList = (const char *)lumpdata.GetMem();
		const char *list_p;
		FSwitchDef *def1, *def2;

		for (list_p = alphSwitchList; list_p[18] || list_p[19]; list_p += 20)
		{
			// [RH] Check for switches that aren't really switches
			if (stricmp (list_p, list_p+9) == 0)
			{
				Printf ("Switch %s in SWITCHES has the same 'on' state\n", list_p);
				continue;
			}
			// [RH] Skip this switch if its textures can't be found.
			if (CheckForTexture (list_p /* .name1 */, FTexture::TEX_Wall, texflags).Exists() &&
				CheckForTexture (list_p + 9 /* .name2 */, FTexture::TEX_Wall, texflags).Exists())
			{
				def1 = (FSwitchDef *)M_Malloc (sizeof(FSwitchDef));
				def2 = (FSwitchDef *)M_Malloc (sizeof(FSwitchDef));
				def1->PreTexture = def2->frames[0].Texture = CheckForTexture (list_p /* .name1 */, FTexture::TEX_Wall, texflags);
				def2->PreTexture = def1->frames[0].Texture = CheckForTexture (list_p + 9, FTexture::TEX_Wall, texflags);
				def1->Sound = def2->Sound = 0;
				def1->NumFrames = def2->NumFrames = 1;
				def1->frames[0].TimeMin = def2->frames[0].TimeMin = 0;
				def1->frames[0].TimeRnd = def2->frames[0].TimeRnd = 0;
				AddSwitchPair(def1, def2);
			}
		}
	}

	mSwitchDefs.ShrinkToFit ();
	qsort (&mSwitchDefs[0], mSwitchDefs.Size(), sizeof(FSwitchDef *), SortSwitchDefs);
}